

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  uint uVar6;
  uint j;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = (ulong)other->header >> 0x22;
  uVar4 = (ulong)this->header >> 0x22;
  if ((uVar4 <= uVar3) &&
     ((*(uint *)(&this[1].header.field_0x0 + uVar4 * 4) &
      ~*(uint *)(&other[1].header.field_0x0 + uVar3 * 4)) == 0)) {
    uVar5 = 0;
    uVar6 = 0xfffffffe;
    do {
      if (uVar5 == uVar4) {
        return (Lit)uVar6;
      }
      uVar7 = 0;
      do {
        if (uVar3 == uVar7) {
          return (Lit)-1;
        }
        uVar1 = *(uint *)(&other[1].header.field_0x0 + uVar7 * 4);
        uVar2 = *(uint *)(&this[1].header.field_0x0 + uVar5 * 4);
        uVar8 = uVar6;
      } while ((uVar2 != uVar1) &&
              ((uVar7 = uVar7 + 1, uVar6 != 0xfffffffe || (uVar8 = uVar2, (uVar1 ^ uVar2) != 1))));
      uVar5 = uVar5 + 1;
      uVar6 = uVar8;
    } while( true );
  }
  return (Lit)-1;
}

Assistant:

inline Lit Clause::subsumes(const Clause &other) const
{
    // if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    // if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);
    assert(!other.header.learnt);
    assert(header.has_extra);
    assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit ret = lit_Undef;
    const Lit *c = (const Lit *)(*this);
    const Lit *d = (const Lit *)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]) {
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}